

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbrush.h
# Opt level: O0

QLinearGradient * __thiscall
QLinearGradient::operator=(QLinearGradient *this,QLinearGradient *param_2)

{
  QGradient *in_RSI;
  QGradient *in_RDI;
  
  QGradient::operator=(in_RSI,in_RDI);
  return (QLinearGradient *)in_RDI;
}

Assistant:

class Q_GUI_EXPORT QLinearGradient : public QGradient
{
public:
    QLinearGradient();
    QLinearGradient(const QPointF &start, const QPointF &finalStop);
    QLinearGradient(qreal xStart, qreal yStart, qreal xFinalStop, qreal yFinalStop);
    ~QLinearGradient();

    QPointF start() const;
    void setStart(const QPointF &start);
    inline void setStart(qreal x, qreal y) { setStart(QPointF(x, y)); }

    QPointF finalStop() const;
    void setFinalStop(const QPointF &stop);
    inline void setFinalStop(qreal x, qreal y) { setFinalStop(QPointF(x, y)); }
}